

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Individual.cpp
# Opt level: O1

Individual * __thiscall
Individual::makeOffspring(Individual *__return_storage_ptr__,Individual *this,Individual *mother)

{
  pointer piVar1;
  pointer piVar2;
  iterator iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int *piVar7;
  undefined8 uVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  shared_ptr<Instance> local_48;
  Individual *local_38;
  
  local_48.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->usedInstance).super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_48.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->usedInstance).super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if (local_48.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_48.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_48.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_48.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_48.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count + 1;
    }
  }
  local_38 = mother;
  Individual(__return_storage_ptr__,&local_48,0);
  if (local_48.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  piVar1 = (this->coresAsignedToTasks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar2 = (this->coresAsignedToTasks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  iVar4 = rand();
  iVar5 = rand();
  if ((this->coresAsignedToTasks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->coresAsignedToTasks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start) {
    iVar11 = (int)((ulong)((long)piVar2 - (long)piVar1) >> 2);
    iVar9 = iVar5 % iVar11 + iVar4 % iVar11;
    if (iVar11 <= iVar9) {
      iVar9 = iVar11;
    }
    iVar9 = iVar9 - iVar4 % iVar11;
    iVar11 = iVar11 - iVar5 % iVar11;
    lVar12 = 0;
    uVar10 = 0;
    do {
      uVar6 = rand();
      if (((uVar6 & 0x80000001) == 1 && 0 < iVar9) || (iVar11 == 0)) {
        piVar1 = (this->coresAsignedToTasks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((ulong)((long)(this->coresAsignedToTasks).super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)piVar1 >> 2) <= uVar10)
        goto LAB_00104d47;
        piVar7 = (int *)((long)piVar1 + lVar12);
        iVar3._M_current =
             (__return_storage_ptr__->coresAsignedToTasks).
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
        ;
        if (iVar3._M_current ==
            (__return_storage_ptr__->coresAsignedToTasks).
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)__return_storage_ptr__,iVar3,piVar7);
        }
        else {
          *iVar3._M_current = *piVar7;
          (__return_storage_ptr__->coresAsignedToTasks).
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
               iVar3._M_current + 1;
        }
        iVar9 = iVar9 + -1;
      }
      else {
        piVar1 = (local_38->coresAsignedToTasks).super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(local_38->coresAsignedToTasks).
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)piVar1 >> 2) <= uVar10) {
LAB_00104d47:
          uVar8 = std::__throw_out_of_range_fmt
                            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                             ,uVar10);
          if (local_48.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_48.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                       ._M_pi);
          }
          _Unwind_Resume(uVar8);
        }
        piVar7 = (int *)((long)piVar1 + lVar12);
        iVar3._M_current =
             (__return_storage_ptr__->coresAsignedToTasks).
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
        ;
        if (iVar3._M_current ==
            (__return_storage_ptr__->coresAsignedToTasks).
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)__return_storage_ptr__,iVar3,piVar7);
        }
        else {
          *iVar3._M_current = *piVar7;
          (__return_storage_ptr__->coresAsignedToTasks).
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
               iVar3._M_current + 1;
        }
        iVar11 = iVar11 + -1;
      }
      uVar10 = uVar10 + 1;
      lVar12 = lVar12 + 4;
    } while (uVar10 < (ulong)((long)(this->coresAsignedToTasks).
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_finish -
                              (long)(this->coresAsignedToTasks).
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start >> 2));
  }
  return __return_storage_ptr__;
}

Assistant:

Individual Individual::makeOffspring(Individual& mother){
	Individual* individuals[2] = {this, &mother};
	Individual offspring(this->usedInstance);

	int numerOfTaks = coresAsignedToTasks.size();
	int startToUseOtherIndividualIdx = rand()%numerOfTaks;
	int fromFatherCount = rand()%numerOfTaks;
	int fromMotherCount=numerOfTaks-fromFatherCount;
	int endToUseOtherIndividualIdx = min(numerOfTaks, startToUseOtherIndividualIdx + fromFatherCount);
	fromFatherCount = endToUseOtherIndividualIdx - startToUseOtherIndividualIdx;


	for(int i = 0; i < coresAsignedToTasks.size(); i++){
		int randomnum=rand()%2;
		if((randomnum==1 && fromFatherCount>0)||fromMotherCount==0){
			offspring.coresAsignedToTasks.push_back( this->coresAsignedToTasks.at(i) );
			fromFatherCount--;
		}
		else{
			offspring.coresAsignedToTasks.push_back( mother.coresAsignedToTasks.at(i) );
			fromMotherCount--;
		}
	}

	return offspring;
}